

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O1

void __thiscall cp::LegTrack::getLegTrack(LegTrack *this,double t,Pose *r_leg_pose)

{
  Pose *pPVar1;
  double *pdVar2;
  undefined4 *puVar3;
  LegTrack *pLVar4;
  double dVar5;
  double lent;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Quat *end;
  Quat *begin;
  ActualDstType actualDst;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Vector2 nex;
  double local_240;
  Quat local_228;
  undefined1 local_208 [112];
  Quat local_198;
  Quat local_178;
  Quat local_158;
  Quat local_138;
  Quat local_118;
  Quat local_f8;
  Quat local_d8;
  Quat local_b8;
  Quat local_98;
  Quat local_78;
  Quat local_58;
  
  if ((*(uint *)(this + 0x444) | 2) == 6) {
    dVar5 = *(double *)(this + 0x618);
    (r_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = *(double *)(this + 0x610);
    (r_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dVar5;
    (r_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = *(double *)(this + 0x620);
    dVar5 = *(double *)(this + 0x638);
    (r_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[0] = *(double *)(this + 0x630);
    (r_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[1] = dVar5;
    dVar5 = *(double *)(this + 0x648);
    (r_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[2] = *(double *)(this + 0x640);
    (r_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[3] = dVar5;
    dVar5 = *(double *)(this + 0x6f8);
    r_leg_pose[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = *(double *)(this + 0x6f0);
    r_leg_pose[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dVar5;
    r_leg_pose[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = *(double *)(this + 0x700);
    dVar5 = *(double *)(this + 0x718);
    r_leg_pose[1].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[0] = *(double *)(this + 0x710);
    r_leg_pose[1].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[1] = dVar5;
    dVar5 = *(double *)(this + 0x728);
    r_leg_pose[1].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[2] = *(double *)(this + 0x720);
    r_leg_pose[1].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[3] = dVar5;
    return;
  }
  uVar7 = (ulong)*(uint *)(this + 0x440);
  dVar5 = *(double *)(this + 0x1e8);
  if (dVar5 * 0.5 <= t) {
    lent = *(double *)(this + 0x1e0);
    if (dVar5 * 0.5 + lent * 0.5 <= t) {
      if (dVar5 * 0.5 + lent <= t) {
        if (*(double *)(this + 0x1f8) < t) goto LAB_0010734d;
        uVar8 = (ulong)(uVar7 == 0);
        lVar9 = uVar7 * 0xe0;
        dVar5 = *(double *)(this + lVar9 + 0x260 + 8);
        r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[0] = *(double *)(this + lVar9 + 0x260);
        r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[1] = dVar5;
        r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2] = *(double *)(this + lVar9 + 0x270);
        dVar5 = *(double *)(this + lVar9 + 0x280 + 8);
        r_leg_pose[uVar7].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[0] = *(double *)(this + lVar9 + 0x280);
        r_leg_pose[uVar7].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[1] = dVar5;
        dVar5 = *(double *)(this + lVar9 + 0x290 + 8);
        pdVar2 = r_leg_pose[uVar7].qq.m_coeffs.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 + 2;
        *pdVar2 = *(double *)(this + lVar9 + 0x290);
        pdVar2[1] = dVar5;
        lVar9 = uVar8 * 0xe0;
        dVar5 = *(double *)(this + lVar9 + 0x260 + 8);
        r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[0] = *(double *)(this + lVar9 + 0x260);
        r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[1] = dVar5;
        r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2] = *(double *)(this + lVar9 + 0x270);
        dVar5 = *(double *)(this + lVar9 + 0x280 + 8);
        r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[0] = *(double *)(this + lVar9 + 0x280);
        r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[1] = dVar5;
        pLVar4 = this + lVar9 + 0x290;
        uVar11 = *(undefined4 *)pLVar4;
        uVar12 = *(undefined4 *)(pLVar4 + 4);
        uVar13 = *(undefined4 *)(pLVar4 + 8);
        uVar14 = *(undefined4 *)(pLVar4 + 0xc);
        goto LAB_00106f14;
      }
      uVar10 = (ulong)(uVar7 == 0);
      local_240 = t - dVar5 * 0.5;
      local_208._32_8_ = *(undefined8 *)(this + 0x420);
      local_208._40_8_ = *(undefined8 *)(this + 0x428);
      local_208._16_8_ = *(undefined8 *)(this + 0x430);
      local_208._24_8_ = *(undefined8 *)(this + 0x438);
      interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::lerp
                ((interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_208,
                 (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x90),
                 (Matrix<double,_2,_1,_0,_2,_1> *)(local_208 + 0x20),lent,local_240);
      uVar6 = *(uint *)(this + 0x440);
      dVar5 = interpolation<double>::inter5
                        ((interpolation<double> *)(this + 0x30),local_240 - lent * 0.5);
      pPVar1 = r_leg_pose + uVar6;
      *(undefined4 *)
       (pPVar1->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array = local_208._0_4_;
      *(undefined4 *)
       ((long)(pPVar1->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 4) = local_208._4_4_;
      *(int *)((pPVar1->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array + 1) = (int)local_208._8_8_;
      *(int *)((long)(pPVar1->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 0xc) = SUB84(local_208._8_8_,4);
      r_leg_pose[uVar6].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] = dVar5;
      uVar8 = (ulong)*(uint *)(this + 0x440);
      lVar9 = uVar8 * 0xe0;
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar9 + 0x630);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar9 + 0x630 + 8);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar9 + 0x640);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar9 + 0x640 + 8);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar9 + 0x280);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar9 + 0x280 + 8);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar9 + 0x290);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar9 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_118
                 ,&local_138,*(double *)(this + 0x1e0),local_240);
      r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[0];
      r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[1];
      pdVar2 = r_leg_pose[uVar8].qq.m_coeffs.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
               2;
      *pdVar2 = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
      pdVar2[1] = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
      lVar9 = uVar10 * 0xe0;
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar9 + 0x630);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar9 + 0x630 + 8);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar9 + 0x640);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar9 + 0x640 + 8);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar9 + 0x280);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar9 + 0x280 + 8);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar9 + 0x290);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar9 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_158
                 ,&local_178,*(double *)(this + 0x1e0),local_240);
      r_leg_pose[uVar10].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[0];
      r_leg_pose[uVar10].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[1];
      pdVar2 = r_leg_pose[uVar10].qq.m_coeffs.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
               2;
      *pdVar2 = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
      pdVar2[1] = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + 0x240);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + 0x248);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + 0x250);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + 600);
      begin = &local_198;
      uVar11 = *(undefined4 *)(this + 0x220);
      uVar12 = *(undefined4 *)(this + 0x224);
      uVar13 = *(undefined4 *)(this + 0x228);
      uVar14 = *(undefined4 *)(this + 0x22c);
      uVar15 = *(undefined4 *)(this + 0x230);
      uVar16 = *(undefined4 *)(this + 0x234);
      uVar17 = *(undefined4 *)(this + 0x238);
      uVar18 = *(undefined4 *)(this + 0x23c);
      end = (Quat *)(local_208 + 0x50);
    }
    else {
      uVar10 = (ulong)(uVar7 == 0);
      local_240 = t + dVar5 * -0.5;
      local_208._64_8_ = *(undefined8 *)(this + 0x420);
      local_208._72_8_ = *(undefined8 *)(this + 0x428);
      local_208._48_8_ = *(undefined8 *)(this + 0x430);
      local_208._56_8_ = *(undefined8 *)(this + 0x438);
      interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::lerp
                ((interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_208,
                 (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x90),
                 (Matrix<double,_2,_1,_0,_2,_1> *)(local_208 + 0x40),lent,local_240);
      uVar6 = *(uint *)(this + 0x440);
      dVar5 = interpolation<double>::inter5((interpolation<double> *)this,local_240);
      pPVar1 = r_leg_pose + uVar6;
      *(undefined4 *)
       (pPVar1->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array = local_208._0_4_;
      *(undefined4 *)
       ((long)(pPVar1->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 4) = local_208._4_4_;
      *(int *)((pPVar1->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array + 1) = (int)local_208._8_8_;
      *(int *)((long)(pPVar1->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 0xc) = SUB84(local_208._8_8_,4);
      r_leg_pose[uVar6].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] = dVar5;
      uVar8 = (ulong)*(uint *)(this + 0x440);
      lVar9 = uVar8 * 0xe0;
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar9 + 0x630);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar9 + 0x630 + 8);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar9 + 0x640);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar9 + 0x640 + 8);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar9 + 0x280);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar9 + 0x280 + 8);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar9 + 0x290);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar9 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_58,
                 &local_78,*(double *)(this + 0x1e0),local_240);
      r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[0];
      r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[1];
      pdVar2 = r_leg_pose[uVar8].qq.m_coeffs.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
               2;
      *pdVar2 = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
      pdVar2[1] = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
      lVar9 = uVar10 * 0xe0;
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar9 + 0x630);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar9 + 0x630 + 8);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar9 + 0x640);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar9 + 0x640 + 8);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar9 + 0x280);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar9 + 0x280 + 8);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar9 + 0x290);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar9 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_98,
                 &local_b8,*(double *)(this + 0x1e0),local_240);
      r_leg_pose[uVar10].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[0];
      r_leg_pose[uVar10].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[1];
      pdVar2 = r_leg_pose[uVar10].qq.m_coeffs.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
               2;
      *pdVar2 = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
      pdVar2[1] = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + 0x240);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + 0x248);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + 0x250);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + 600);
      begin = &local_d8;
      uVar11 = *(undefined4 *)(this + 0x220);
      uVar12 = *(undefined4 *)(this + 0x224);
      uVar13 = *(undefined4 *)(this + 0x228);
      uVar14 = *(undefined4 *)(this + 0x22c);
      uVar15 = *(undefined4 *)(this + 0x230);
      uVar16 = *(undefined4 *)(this + 0x234);
      uVar17 = *(undefined4 *)(this + 0x238);
      uVar18 = *(undefined4 *)(this + 0x23c);
      end = &local_f8;
    }
    *(undefined4 *)
     (end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
     array = uVar11;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 4) = uVar12;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 1) = uVar13;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0xc) = uVar14;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 2) = uVar15;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0x14) = uVar16;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 3) = uVar17;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0x1c) = uVar18;
    interpolation<Eigen::Quaternion<double,_0>_>::lerp
              (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),begin,end,
               *(double *)(this + 0x1e0),local_240);
    *(double *)(this + 0x210) =
         local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[2];
    *(double *)(this + 0x218) =
         local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[3];
    *(double *)(this + 0x200) =
         local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[0];
    *(double *)(this + 0x208) =
         local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[1];
  }
  else {
    lVar9 = uVar7 * 0xe0;
    dVar5 = *(double *)(this + lVar9 + 0x610 + 8);
    r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = *(double *)(this + lVar9 + 0x610);
    r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = dVar5;
    r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = *(double *)(this + lVar9 + 0x620);
    dVar5 = *(double *)(this + lVar9 + 0x630 + 8);
    r_leg_pose[uVar7].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[0] = *(double *)(this + lVar9 + 0x630);
    r_leg_pose[uVar7].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[1] = dVar5;
    dVar5 = *(double *)(this + lVar9 + 0x640 + 8);
    pdVar2 = r_leg_pose[uVar7].qq.m_coeffs.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array + 2
    ;
    *pdVar2 = *(double *)(this + lVar9 + 0x640);
    pdVar2[1] = dVar5;
    lVar9 = (ulong)(uVar7 == 0) * 0xe0;
    dVar5 = *(double *)(this + lVar9 + 0x630 + 8);
    r_leg_pose[uVar7 == 0].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[0] = *(double *)(this + lVar9 + 0x630);
    r_leg_pose[uVar7 == 0].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[1] = dVar5;
    pLVar4 = this + lVar9 + 0x640;
    uVar11 = *(undefined4 *)pLVar4;
    uVar12 = *(undefined4 *)(pLVar4 + 4);
    uVar13 = *(undefined4 *)(pLVar4 + 8);
    uVar14 = *(undefined4 *)(pLVar4 + 0xc);
LAB_00106f14:
    puVar3 = (undefined4 *)
             ((long)(r_leg_pose->qq).m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + lVar9 + 0x10);
    *puVar3 = uVar11;
    puVar3[1] = uVar12;
    puVar3[2] = uVar13;
    puVar3[3] = uVar14;
  }
LAB_0010734d:
  uVar7 = (ulong)(uVar7 == 0);
  dVar5 = *(double *)(this + uVar7 * 0xe0 + 0x610 + 8);
  r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[0] = *(double *)(this + uVar7 * 0xe0 + 0x610);
  r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[1] = dVar5;
  r_leg_pose[uVar7].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[2] = *(double *)(this + uVar7 * 0xe0 + 0x620);
  return;
}

Assistant:

void LegTrack::getLegTrack(double t, Pose r_leg_pose[]) {
  rl spl = swl == right ? left : right;
  if (ws == starting1 || ws == stopping2) {
      r_leg_pose[right].set(bfr_landpose[right]);
      r_leg_pose[left].set(bfr_landpose[left]);
  } else {
    if (t < dst_s*0.5) {
        r_leg_pose[swl].set(bfr_landpose[swl]);
        r_leg_pose[spl].set(bfr_landpose[spl].q());
    } else if (t < dst_s*0.5 + sst_s*0.5) {
        double sst_s_time = t - dst_s*0.5;
        Vector2 nex = inter_vec2.lerp(bfr, ref, sst_s, sst_s_time);
        r_leg_pose[swl].set(Vector3(nex.x(), nex.y(), inter_z_1.inter5(sst_s_time)));
        r_leg_pose[swl].set(inter_q.lerp(bfr_landpose[swl].q(), ref_landpose[swl].q(), sst_s, sst_s_time));
        r_leg_pose[spl].set(inter_q.lerp(bfr_landpose[spl].q(), ref_landpose[spl].q(), sst_s, sst_s_time));
        waist = inter_q.lerp(bfr_waist_r, ref_waist_r, sst_s, sst_s_time);
    } else if (t < dst_s*0.5 + sst_s) {
        double sst_s_time = t - dst_s*0.5;
        double sst_s_ht = sst_s_time - sst_s*0.5;
        Vector2 nex = inter_vec2.lerp(bfr, ref, sst_s, sst_s_time);
        r_leg_pose[swl].set(Vector3(nex.x(), nex.y(), inter_z_2.inter5(sst_s_ht)));
        r_leg_pose[swl].set(inter_q.lerp(bfr_landpose[swl].q(), ref_landpose[swl].q(), sst_s, sst_s_time));
        r_leg_pose[spl].set(inter_q.lerp(bfr_landpose[spl].q(), ref_landpose[spl].q(), sst_s, sst_s_time));
        waist = inter_q.lerp(bfr_waist_r, ref_waist_r, sst_s, sst_s_time);
    } else if (t <= st_s) {
        r_leg_pose[swl].set(ref_landpose[swl]);
        r_leg_pose[spl].set(ref_landpose[spl]);
    }
    r_leg_pose[spl].set(bfr_landpose[spl].p());
  }
}